

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::DuplicateOrdinalDetector::check
          (DuplicateOrdinalDetector *this,Reader ordinal)

{
  void *pvVar1;
  undefined8 uVar2;
  Maybe<capnp::compiler::LocatedInteger::Reader> *pMVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ErrorReporter *pEVar9;
  char (*in_R8) [46];
  char (*params_2) [23];
  String local_48;
  char local_30 [8];
  
  if (ordinal._reader.dataSize < 0x40) {
    if (this->expectedOrdinal == 0) {
      uVar5 = 0;
LAB_00169622:
      this->expectedOrdinal = uVar5 + 1;
      if ((this->lastOrdinalLocation).ptr.isSet == true) {
        (this->lastOrdinalLocation).ptr.isSet = false;
      }
      uVar2 = ordinal._reader._32_8_;
      pMVar3 = &this->lastOrdinalLocation;
      *(int *)((long)&(pMVar3->ptr).field_1 + 0x20) = (int)uVar2;
      *(short *)((long)&(pMVar3->ptr).field_1 + 0x24) = (short)((ulong)uVar2 >> 0x20);
      *(short *)((long)&(pMVar3->ptr).field_1 + 0x26) = (short)((ulong)uVar2 >> 0x30);
      *(int *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x28) = ordinal._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x2c) =
           ordinal._reader._44_4_;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.data = ordinal._reader.data;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.pointers = ordinal._reader.pointers;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.segment = ordinal._reader.segment;
      (this->lastOrdinalLocation).ptr.field_1.value._reader.capTable = ordinal._reader.capTable;
      (this->lastOrdinalLocation).ptr.isSet = true;
      return;
    }
    pEVar9 = this->errorReporter;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    uVar5 = this->expectedOrdinal;
    if ((ulong)uVar5 <= *ordinal._reader.data) {
      if ((ulong)uVar5 < *ordinal._reader.data) {
        pEVar9 = this->errorReporter;
        kj::str<char_const(&)[18],unsigned_int&,char_const(&)[46]>
                  (&local_48,(kj *)"Skipped ordinal @",(char (*) [18])&this->expectedOrdinal,
                   (uint *)".  Ordinals must be sequential with no holes.",in_R8);
        pcVar6 = local_48.content.ptr;
        if (local_48.content.size_ == 0) {
          pcVar6 = "";
        }
        uVar7 = 0;
        if (ordinal._reader.dataSize < 0x60) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*(uint *)((long)ordinal._reader.data + 8);
          if (0x7f < ordinal._reader.dataSize) {
            uVar7 = (ulong)*(uint *)((long)ordinal._reader.data + 0xc);
          }
        }
        (**pEVar9->_vptr_ErrorReporter)
                  (pEVar9,uVar8,uVar7,pcVar6,local_48.content.size_ + (local_48.content.size_ == 0))
        ;
        sVar4 = local_48.content.size_;
        pcVar6 = local_48.content.ptr;
        if (local_48.content.ptr != (char *)0x0) {
          local_48.content.ptr = (char *)0x0;
          local_48.content.size_ = 0;
          (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                    (local_48.content.disposer,pcVar6,1,sVar4,sVar4,0);
        }
        this->expectedOrdinal = *ordinal._reader.data + 1;
        return;
      }
      goto LAB_00169622;
    }
    pEVar9 = this->errorReporter;
    uVar7 = 0;
    if (ordinal._reader.dataSize < 0x60) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)*(uint *)((long)ordinal._reader.data + 8);
      if (0x7f < ordinal._reader.dataSize) {
        uVar7 = (ulong)*(uint *)((long)ordinal._reader.data + 0xc);
      }
    }
  }
  params_2 = (char (*) [23])0x1a;
  (**pEVar9->_vptr_ErrorReporter)(pEVar9,uVar8,uVar7,"Duplicate ordinal number.");
  if ((this->lastOrdinalLocation).ptr.isSet == true) {
    if (*(uint *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x20) < 0x40) {
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[7] = '\0';
    }
    else {
      local_30 = *(this->lastOrdinalLocation).ptr.field_1.value._reader.data;
    }
    pEVar9 = this->errorReporter;
    kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
              (&local_48,(kj *)"Ordinal @",(char (*) [10])local_30,
               (unsigned_long *)" originally used here.",params_2);
    pcVar6 = local_48.content.ptr;
    if (local_48.content.size_ == 0) {
      pcVar6 = "";
    }
    uVar5 = *(uint *)((long)&(this->lastOrdinalLocation).ptr.field_1 + 0x20);
    uVar7 = 0;
    if (uVar5 < 0x60) {
      uVar8 = 0;
    }
    else {
      pvVar1 = (this->lastOrdinalLocation).ptr.field_1.value._reader.data;
      uVar8 = (ulong)*(uint *)((long)pvVar1 + 8);
      if (0x7f < uVar5) {
        uVar7 = (ulong)*(uint *)((long)pvVar1 + 0xc);
      }
    }
    (**pEVar9->_vptr_ErrorReporter)
              (pEVar9,uVar8,uVar7,pcVar6,local_48.content.size_ + (local_48.content.size_ == 0));
    sVar4 = local_48.content.size_;
    pcVar6 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar6,1,sVar4,sVar4,0);
    }
    if ((this->lastOrdinalLocation).ptr.isSet == true) {
      (this->lastOrdinalLocation).ptr.isSet = false;
    }
  }
  return;
}

Assistant:

void check(LocatedInteger::Reader ordinal) {
    if (ordinal.getValue() < expectedOrdinal) {
      errorReporter.addErrorOn(ordinal, "Duplicate ordinal number.");
      KJ_IF_SOME(last, lastOrdinalLocation) {
        errorReporter.addErrorOn(
            last, kj::str("Ordinal @", last.getValue(), " originally used here."));
        // Don't report original again.
        lastOrdinalLocation = kj::none;
      }
    } else if (ordinal.getValue() > expectedOrdinal) {
      errorReporter.addErrorOn(ordinal,
          kj::str("Skipped ordinal @", expectedOrdinal, ".  Ordinals must be sequential with no "
                  "holes."));
      expectedOrdinal = ordinal.getValue() + 1;
    } else {
      ++expectedOrdinal;
      lastOrdinalLocation = ordinal;
    }
  }